

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QRect dockedGeometry(QWidget *widget)

{
  undefined4 uVar1;
  QWidgetData *pQVar2;
  ulong uVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  QDockWidgetLayout *this;
  QRect QVar7;
  
  QWidget::layout(widget);
  this = (QDockWidgetLayout *)QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
  iVar6 = 0;
  if (this != (QDockWidgetLayout *)0x0) {
    bVar5 = QDockWidgetLayout::nativeWindowDeco(this);
    iVar6 = 0;
    if (bVar5) {
      iVar6 = QDockWidgetLayout::titleHeight(this);
    }
  }
  pQVar2 = widget->data;
  uVar3._0_4_ = (pQVar2->crect).x1;
  uVar3._4_4_ = (pQVar2->crect).y1;
  uVar1 = (pQVar2->crect).x2;
  uVar4 = (pQVar2->crect).y2;
  QVar7.y2.m_i = uVar4;
  QVar7.x2.m_i = uVar1;
  QVar7._0_8_ = uVar3 & 0xffffffff | (ulong)(uint)(uVar3._4_4_ - iVar6) << 0x20;
  return QVar7;
}

Assistant:

static QRect dockedGeometry(QWidget *widget)
{
    int titleHeight = 0;

    QDockWidgetLayout *layout
        = qobject_cast<QDockWidgetLayout*>(widget->layout());
    if (layout && layout->nativeWindowDeco())
        titleHeight = layout->titleHeight();

    QRect result = widget->geometry();
    result.adjust(0, -titleHeight, 0, 0);
    return result;
}